

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_config.c
# Opt level: O2

anytype_t * anytype_from_str(anytype_t *val,int t,char *str)

{
  byte bVar1;
  int iVar2;
  char *pcVar3;
  uint uVar4;
  double dVar5;
  
  if (val == (anytype_t *)0x0) goto LAB_0010d0ab;
  if (str == (char *)0x0) {
    if ((t & 8U) != 0 && val->ptr != (void *)0x0) {
      ckd_free(val->ptr);
    }
LAB_0010d0c8:
    val->ptr = (void *)0x0;
    return val;
  }
  bVar1 = *str;
  if (bVar1 == 0) {
LAB_0010d0ab:
    val = (anytype_t *)0x0;
  }
  else {
    switch(t) {
    case 2:
    case 3:
      iVar2 = __isoc99_sscanf(str,"%ld",val);
      if (iVar2 == 1) {
        return val;
      }
      goto LAB_0010d0ab;
    case 4:
    case 5:
      dVar5 = atof_c(str);
      val->fl = dVar5;
      break;
    default:
      val = (anytype_t *)0x0;
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_config.c"
              ,0x2be,"Unknown argument type: %d\n");
      break;
    case 8:
    case 9:
      if (val->ptr != (void *)0x0) {
        ckd_free(val->ptr);
      }
      pcVar3 = __ckd_salloc__(str,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_config.c"
                              ,699);
      val->ptr = pcVar3;
      break;
    case 0x10:
    case 0x11:
      uVar4 = bVar1 - 0x30;
      if (uVar4 < 0x3f) {
        if ((0x4040000040400001U >> ((ulong)uVar4 & 0x3f) & 1) != 0) goto LAB_0010d0c8;
        if ((0x21000000002U >> ((ulong)uVar4 & 0x3f) & 1) == 0) goto LAB_0010d0ff;
      }
      else {
LAB_0010d0ff:
        if ((bVar1 != 0x79) && (bVar1 != 0x74)) {
          err_msg(ERR_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_config.c"
                  ,0x2b3,"Unparsed boolean value \'%s\'\n",str);
          return (anytype_t *)0x0;
        }
      }
      val->i = 1;
    }
  }
  return val;
}

Assistant:

anytype_t *
anytype_from_str(anytype_t *val, int t, const char *str)
{
    if (val == NULL)
        return NULL;
    if (str == NULL) {
        if (val->ptr && (t & ARG_STRING))
            ckd_free(val->ptr);
        memset(val, 0, sizeof(*val));
        return val;
    }
    if (strlen(str) == 0)
        return NULL;
    switch (t) {
    case ARG_INTEGER:
    case REQARG_INTEGER:
        if (sscanf(str, "%ld", &val->i) != 1)
            return NULL;
        break;
    case ARG_FLOATING:
    case REQARG_FLOATING:
        val->fl = atof_c(str);
        break;
    case ARG_BOOLEAN:
    case REQARG_BOOLEAN:
        if ((str[0] == 'y') || (str[0] == 't') ||
            (str[0] == 'Y') || (str[0] == 'T') || (str[0] == '1')) {
            val->i = TRUE;
        }
        else if ((str[0] == 'n') || (str[0] == 'f') ||
                 (str[0] == 'N') || (str[0] == 'F') |
                 (str[0] == '0')) {
            val->i = FALSE;
        }
        else {
            E_ERROR("Unparsed boolean value '%s'\n", str);
            return NULL;
        }
        break;
    case ARG_STRING:
    case REQARG_STRING:
        if (val->ptr)
            ckd_free(val->ptr);
        val->ptr = ckd_salloc(str);
        break;
    default:
        E_ERROR("Unknown argument type: %d\n", t);
        return NULL;
    }
    return val;
}